

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtDecide.c
# Opt level: O3

Vec_Vec_t * Cgt_ManDecideArea(Aig_Man_t *pAig,Vec_Vec_t *vGatesAll,int nOdcMax,int fVerbose)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  Aig_Man_t *pAig_00;
  Vec_Ptr_t *__ptr;
  int iVar4;
  uint uVar5;
  Vec_Vec_t *p;
  void **ppvVar6;
  void *pvVar7;
  ulong uVar8;
  long lVar9;
  long extraout_RDX;
  long lVar10;
  long lVar11;
  ulong uVar12;
  int level;
  float fVar13;
  timespec ts;
  long local_58;
  timespec local_50;
  Aig_Man_t *local_40;
  Vec_Ptr_t *local_38;
  
  uVar8 = (ulong)(uint)fVerbose;
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    local_58 = 1;
    lVar10 = extraout_RDX;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    uVar8 = -(lVar10 >> 0x3f);
    lVar10 = (lVar10 >> 7) + uVar8 + local_50.tv_sec * -1000000;
    local_58 = lVar10;
  }
  local_38 = Cgt_ManCompleteGates(pAig,vGatesAll,(int)lVar10,(int)uVar8);
  uVar2 = local_38->nSize;
  lVar10 = (long)(int)uVar2;
  if (0 < lVar10) {
    ppvVar6 = local_38->pArray;
    lVar9 = 0;
    do {
      puVar1 = (ulong *)(((ulong)ppvVar6[lVar9] & 0xfffffffffffffffe) + 0x18);
      *puVar1 = *puVar1 | 0x10;
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
  }
  uVar3 = pAig->nRegs;
  local_40 = pAig;
  p = (Vec_Vec_t *)malloc(0x10);
  uVar5 = 8;
  if (6 < uVar3 - 1) {
    uVar5 = uVar3;
  }
  p->nCap = uVar5;
  if (uVar5 == 0) {
    ppvVar6 = (void **)0x0;
  }
  else {
    ppvVar6 = (void **)malloc((long)(int)uVar5 << 3);
  }
  p->pArray = ppvVar6;
  if (0 < (int)uVar3) {
    uVar8 = 0;
    do {
      pvVar7 = calloc(1,0x10);
      ppvVar6[uVar8] = pvVar7;
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
  p->nSize = uVar3;
  iVar4 = vGatesAll->nSize;
  if (0 < iVar4) {
    lVar9 = 0;
    do {
      if (iVar4 <= lVar9) {
LAB_004f5099:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      pvVar7 = vGatesAll->pArray[lVar9];
      if (0 < *(int *)((long)pvVar7 + 4)) {
        lVar11 = 0;
        do {
          pvVar7 = *(void **)(*(long *)((long)pvVar7 + 8) + lVar11 * 8);
          if ((*(byte *)(((ulong)pvVar7 & 0xfffffffffffffffe) + 0x18) & 0x10) != 0) {
            Vec_VecPush(p,(int)lVar9,pvVar7);
            iVar4 = vGatesAll->nSize;
          }
          if (iVar4 <= lVar9) goto LAB_004f5099;
          lVar11 = lVar11 + 1;
          pvVar7 = vGatesAll->pArray[lVar9];
        } while (lVar11 < *(int *)((long)pvVar7 + 4));
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar4);
  }
  __ptr = local_38;
  pAig_00 = local_40;
  if (0 < (int)uVar2) {
    ppvVar6 = local_38->pArray;
    lVar9 = 0;
    do {
      puVar1 = (ulong *)(((ulong)ppvVar6[lVar9] & 0xfffffffffffffffe) + 0x18);
      *puVar1 = *puVar1 & 0xffffffffffffffef;
      lVar9 = lVar9 + 1;
    } while (lVar10 != lVar9);
  }
  if ((long)p->nSize < 1) {
    uVar8 = 0;
  }
  else {
    lVar10 = 0;
    uVar8 = 0;
    do {
      uVar8 = (ulong)((int)uVar8 + (uint)(0 < *(int *)((long)p->pArray[lVar10] + 4)));
      lVar10 = lVar10 + 1;
    } while (p->nSize != lVar10);
  }
  if (fVerbose != 0) {
    if ((long)vGatesAll->nSize < 1) {
      uVar12 = 0;
    }
    else {
      lVar10 = 0;
      uVar12 = 0;
      do {
        uVar12 = (ulong)(uint)((int)uVar12 + *(int *)((long)vGatesAll->pArray[lVar10] + 4));
        lVar10 = lVar10 + 1;
      } while (vGatesAll->nSize != lVar10);
    }
    printf("Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n",uVar12,uVar8,
           (ulong)(uint)local_40->nRegs);
    fVar13 = Cgt_ManComputeCoverage(pAig_00,p);
    iVar4 = 0x9f36bb;
    printf("Complete gates = %6d. Gated transitions = %5.2f %%. ",(double)fVar13,(ulong)uVar2);
    Abc_Print(iVar4,"%s =","Time");
    level = 3;
    iVar4 = clock_gettime(3,&local_50);
    if (iVar4 < 0) {
      lVar10 = -1;
    }
    else {
      lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(level,"%9.2f sec\n",(double)(lVar10 + local_58) / 1000000.0);
  }
  ppvVar6 = __ptr->pArray;
  if (ppvVar6 != (void **)0x0) {
    free(ppvVar6);
  }
  free(__ptr);
  return p;
}

Assistant:

Vec_Vec_t * Cgt_ManDecideArea( Aig_Man_t * pAig, Vec_Vec_t * vGatesAll, int nOdcMax, int fVerbose )
{
    Vec_Vec_t * vGates;
    Vec_Ptr_t * vCompletes, * vOne;
    Aig_Obj_t * pGate;
    int i, k, Counter = 0;
    abctime clk = Abc_Clock();
    // derive and label complete gates
    vCompletes = Cgt_ManCompleteGates( pAig, vGatesAll, nOdcMax, fVerbose );
    // label complete gates
    Vec_PtrForEachEntry( Aig_Obj_t *, vCompletes, pGate, i )
        Aig_Regular(pGate)->fMarkA = 1;
    // select only complete gates
    vGates = Vec_VecStart( Saig_ManRegNum(pAig) );
    Vec_VecForEachEntry( Aig_Obj_t *, vGatesAll, pGate, i, k )
        if ( Aig_Regular(pGate)->fMarkA )
            Vec_VecPush( vGates, i, pGate );
    // unlabel complete gates
    Vec_PtrForEachEntry( Aig_Obj_t *, vCompletes, pGate, i )
        Aig_Regular(pGate)->fMarkA = 0;
    // count the number of gated flops
    Vec_VecForEachLevel( vGates, vOne, i )
    {
        Counter += (int)(Vec_PtrSize(vOne) > 0);
//        printf( "%d ", Vec_PtrSize(vOne) );
    }
//    printf( "\n" );
    if ( fVerbose )
    {
        printf( "Gating signals = %6d. Gated flops = %6d. (Total flops = %6d.)\n", 
            Vec_VecSizeSize(vGatesAll), Counter, Saig_ManRegNum(pAig) );
        printf( "Complete gates = %6d. Gated transitions = %5.2f %%. ", 
            Vec_PtrSize(vCompletes), Cgt_ManComputeCoverage(pAig, vGates) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    Vec_PtrFree( vCompletes );
    return vGates;
}